

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O0

void operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>>
               (ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
                *t)

{
  ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  *pcVar1;
  ct_variable<1UL> *rhs;
  ct_variable<1UL> *rhs_00;
  ct_variable<0UL> *rhs_01;
  ct_variable<2UL> *rhs_02;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  local_23 [2];
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  local_1f [2];
  ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  local_1b [2];
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  local_17;
  undefined1 local_15 [2];
  undefined2 local_13;
  undefined1 local_11 [4];
  ct_constant<7L> c7;
  ct_constant<5L> c5;
  ct_variable<2UL> z;
  ct_variable<1UL> y;
  ct_variable<0UL> x;
  ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  *t_local;
  
  unique0x10000240 = t;
  viennamath::ct_variable<0UL>::ct_variable((ct_variable<0UL> *)local_11);
  viennamath::ct_variable<1UL>::ct_variable((ct_variable<1UL> *)((long)&local_13 + 1));
  viennamath::ct_variable<2UL>::ct_variable((ct_variable<2UL> *)&local_13);
  viennamath::ct_constant<5L>::ct_constant((ct_constant<5L> *)(local_15 + 1));
  viennamath::ct_constant<7L>::ct_constant((ct_constant<7L> *)local_15);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_variable<0ul>>
            (stack0xfffffffffffffff0,(ct_variable<0UL> *)local_11);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_constant<5l>>
            (stack0xfffffffffffffff0,(ct_constant<5L> *)(local_15 + 1));
  operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_constant<7l>>
            (stack0xfffffffffffffff0,(ct_constant<7L> *)local_15);
  pcVar1 = stack0xfffffffffffffff0;
  viennamath::operator+((type *)local_11,(ct_variable<0UL> *)((long)&local_13 + 1),rhs);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>
            (pcVar1,&local_17);
  pcVar1 = stack0xfffffffffffffff0;
  viennamath::operator*((type *)&local_13,(ct_variable<2UL> *)((long)&local_13 + 1),rhs_00);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>>
            (pcVar1,local_1b);
  pcVar1 = stack0xfffffffffffffff0;
  viennamath::operator/((type *)(local_15 + 1),(ct_constant<5L> *)local_11,rhs_01);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>
            (pcVar1,local_1f);
  pcVar1 = stack0xfffffffffffffff0;
  viennamath::operator-((type *)local_15,(ct_constant<7L> *)&local_13,rhs_02);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>
            (pcVar1,local_23);
  return;
}

Assistant:

void operations_test(T const & t)
{
  viennamath::ct_variable<0> x;
  viennamath::ct_variable<1> y;
  viennamath::ct_variable<2> z;
  viennamath::ct_constant<5> c5;
  viennamath::ct_constant<7> c7;

  operations_test(t, x);
  operations_test(t, c5);
  operations_test(t, c7);
  operations_test(t, x + y);
  operations_test(t, z * y);
  operations_test(t, c5 / x);
  operations_test(t, c7 - z);
}